

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O3

bool __thiscall
deqp::egl::SurfaceConfig::compareTo
          (SurfaceConfig *this,SurfaceConfig *b,BVec4 *specifiedRGBColors,
          BVec2 *specifiedLuminanceColors,bool yuvPlaneBppSpecified)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  TestError *this_00;
  long lVar4;
  
  bVar2 = operator==(this,b);
  if (bVar2) {
    return false;
  }
  lVar4 = 0;
  do {
    if (lVar4 == 0x18) {
      bVar2 = compareColorBufferBits
                        (this,b,specifiedRGBColors,specifiedLuminanceColors,yuvPlaneBppSpecified);
      if (bVar2) {
        return true;
      }
      bVar2 = compareColorBufferBits
                        (b,this,specifiedRGBColors,specifiedLuminanceColors,yuvPlaneBppSpecified);
      if (bVar2) {
        return false;
      }
    }
    else {
      pcVar1 = *(code **)((long)compareTo::compareFuncs + lVar4);
      cVar3 = (*pcVar1)(this,b);
      if (cVar3 != '\0') {
        return true;
      }
      cVar3 = (*pcVar1)(b,this);
      if (cVar3 != '\0') {
        return false;
      }
    }
    lVar4 = lVar4 + 8;
    if (lVar4 == 0x60) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unable to compare configs - duplicate ID?",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x119);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  } while( true );
}

Assistant:

bool compareTo (const SurfaceConfig& b, const tcu::BVec4& specifiedRGBColors, const tcu::BVec2& specifiedLuminanceColors, bool yuvPlaneBppSpecified) const
	{
		static const SurfaceConfig::CompareFunc compareFuncs[] =
		{
			SurfaceConfig::compareCaveat,
			SurfaceConfig::compareColorBufferType,
			SurfaceConfig::compareColorComponentType,
			DE_NULL, // SurfaceConfig::compareColorBufferBits,
			SurfaceConfig::compareAttributeSmaller<EGL_BUFFER_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_SAMPLE_BUFFERS>,
			SurfaceConfig::compareAttributeSmaller<EGL_SAMPLES>,
			SurfaceConfig::compareAttributeSmaller<EGL_DEPTH_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_STENCIL_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_ALPHA_MASK_SIZE>,
			SurfaceConfig::compareYuvOrder,
			SurfaceConfig::compareAttributeSmaller<EGL_CONFIG_ID>
		};

		if (*this == b)
			return false; // std::sort() can compare object to itself.

		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(compareFuncs); ndx++)
		{
			if (!compareFuncs[ndx])
			{
				if (compareColorBufferBits(*this, b, specifiedRGBColors, specifiedLuminanceColors, yuvPlaneBppSpecified))
					return true;
				else if (compareColorBufferBits(b, *this, specifiedRGBColors, specifiedLuminanceColors, yuvPlaneBppSpecified))
					return false;

				continue;
			}

			if (compareFuncs[ndx](*this, b))
				return true;
			else if (compareFuncs[ndx](b, *this))
				return false;
		}

		TCU_FAIL("Unable to compare configs - duplicate ID?");
	}